

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

void __thiscall
GlobOptBlockData::MergeValueMaps
          (GlobOptBlockData *this,BasicBlock *toBlock,BasicBlock *fromBlock,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge)

{
  ushort uVar1;
  uint uVar2;
  SymID SVar3;
  Loop *pLVar4;
  BVSparse<Memory::JitArenaAllocator> *mergedValueTypesTrackedForKills;
  GlobHashTable *pGVar5;
  Value *pVVar6;
  Value *fromDataValue;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  Type pJVar7;
  Type pBVar8;
  BasicBlock *pBVar9;
  code *pcVar10;
  bool bVar11;
  BOOLEAN BVar12;
  undefined4 *puVar13;
  GlobOpt *pGVar14;
  BVSparse<Memory::JitArenaAllocator> *pBVar15;
  Type *pTVar16;
  Type *pTVar17;
  Value **ppVVar18;
  Type_conflict pBVar19;
  SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *pSVar20;
  Type *ppFVar21;
  Type_conflict pBVar22;
  ulong uVar23;
  BasicBlock *pBVar24;
  undefined1 local_f8 [8];
  ValueSetByValueNumber mergedValues;
  ValueNumber local_78;
  uint local_74;
  undefined1 local_70 [8];
  EditingIterator iter;
  Value *local_48;
  Value *newValue;
  Iterator iter2;
  
  uVar1 = *(ushort *)&toBlock->field_0x18;
  pLVar4 = toBlock->loop;
  pGVar14 = this->globOpt;
  mergedValues.
  super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .stats = (Type)symsCreatedForMerge;
  if (pGVar14->valuesCreatedForMerge->count != pGVar14->valuesCreatedForMerge->freeCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2eb,"(this->globOpt->valuesCreatedForMerge->Count() == 0)",
                        "this->globOpt->valuesCreatedForMerge->Count() == 0");
    if (!bVar11) goto LAB_00492029;
    *puVar13 = 0;
    pGVar14 = this->globOpt;
  }
  JsUtil::
  BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    *)local_f8,pGVar14->tempAlloc,0x40);
  mergedValueTypesTrackedForKills = this->globOpt->tempBv;
  pBVar15 = mergedValueTypesTrackedForKills;
  do {
    pBVar15 = (BVSparse<Memory::JitArenaAllocator> *)pBVar15->head;
    if (pBVar15 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_00491a1d;
  } while (((Type *)&pBVar15->alloc)->word == 0);
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar13 = 1;
  bVar11 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                      ,0x2ef,"(mergedValueTypesTrackedForKills->IsEmpty())",
                      "mergedValueTypesTrackedForKills->IsEmpty()");
  if (bVar11) {
    *puVar13 = 0;
LAB_00491a1d:
    JsUtil::
    BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Clear(&this->valuesToKillOnCalls->
             super_BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           );
    iter.last = (NodeBase *)this->symToValueMap;
    if (((GlobHashTable *)iter.last)->tableSize != 0) {
      pGVar5 = (fromBlock->globOptData).symToValueMap;
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar23 = 0;
      local_74 = (uVar1 & 4) >> 2;
      do {
        iter2.list = pGVar5->table + uVar23;
        newValue = (Value *)iter2.list;
        if (iter2.list ==
            (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar11) goto LAB_00492029;
          *puVar13 = 0;
        }
        pSVar20 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                  ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        iter2.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0
        ;
        if (pSVar20 !=
            (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)newValue) {
          iter2.list = pSVar20;
        }
        local_70 = (undefined1  [8])(iter.last[2].next + uVar23 * 2);
        iter.super_Iterator.current = (NodeBase *)0x0;
        iter.super_Iterator.list =
             (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_70;
        while( true ) {
          bVar11 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                   EditingIterator::Next((EditingIterator *)local_70);
          if (!bVar11) break;
          pTVar16 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data((Iterator *)local_70);
          if (iter2.list !=
              (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)newValue
              && iter2.list !=
                 (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            while (uVar2 = pTVar16->value->m_id,
                  pTVar17 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                            ::Iterator::Data((Iterator *)&newValue), uVar2 < pTVar17->value->m_id) {
              if (iter2.list ==
                  (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar11 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
                if (!bVar11) goto LAB_00492029;
                *puVar13 = 0;
              }
              pSVar20 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                        ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
              iter2.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                            *)0x0;
              if (pSVar20 !=
                  (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                  newValue) {
                iter2.list = pSVar20;
              }
              if ((iter2.list ==
                   (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0)
                 || (iter2.list ==
                     (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                     newValue)) break;
            }
          }
          local_48 = (Value *)0x0;
          if ((iter2.list ==
               (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
             (iter2.list ==
              (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)newValue))
          {
LAB_00491d57:
            pSVar20 = iter.super_Iterator.list;
            this_00 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                      (iter.last)->next;
            SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
            EditingIterator::UnlinkCurrentNode((EditingIterator *)local_70);
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                      (this_00,pSVar20,0x18);
          }
          else {
            SVar3 = pTVar16->value->m_id;
            pTVar17 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                      Iterator::Data((Iterator *)&newValue);
            if (SVar3 == pTVar17->value->m_id) {
              if ((uVar1 & 4) == 0) {
                bVar11 = false;
              }
              else {
                bVar11 = false;
                if ((pLVar4 != (Loop *)0x0) &&
                   (bVar11 = false, this->globOpt->prePassLoop == (Loop *)0x0)) {
                  BVar12 = BVSparse<Memory::JitArenaAllocator>::Test
                                     (pLVar4->symsAssignedToInLoop,pTVar16->value->m_id);
                  bVar11 = BVar12 != '\0';
                }
              }
              pVVar6 = pTVar16->element;
              pTVar17 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                        Iterator::Data((Iterator *)&newValue);
              fromDataValue = pTVar17->element;
              pTVar17 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                        Iterator::Data((Iterator *)&newValue);
              local_48 = MergeValues(this,pVVar6,fromDataValue,pTVar17->value,SUB41(local_74,0),
                                     bVar11,symsRequiringCompensation,
                                     (BVSparse<Memory::JitArenaAllocator> *)
                                     mergedValues.
                                     super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                     .stats);
            }
            if (local_48 == (Value *)0x0) goto LAB_00491d57;
            local_78 = local_48->valueNumber;
            ppVVar18 = JsUtil::
                       BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       ::Lookup((BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                 *)local_f8,&local_78);
            pVVar6 = *ppVVar18;
            if (pVVar6 == (Value *)0x0) {
              JsUtil::
              BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::Add((BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     *)local_f8,&local_48);
            }
            else {
              BVar12 = BVSparse<Memory::JitArenaAllocator>::Test
                                 (this->globOpt->byteCodeConstantValueNumbersBv,
                                  local_48->valueNumber);
              if ((BVar12 == '\0') && (local_48 != pVVar6)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar11 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                    ,0x326,"(newValue == previouslyMergedValue)",
                                    "newValue == previouslyMergedValue");
                if (!bVar11) goto LAB_00492029;
                *puVar13 = 0;
              }
            }
            GlobOpt::TrackMergedValueForKills
                      (this->globOpt,local_48,this,mergedValueTypesTrackedForKills);
            pTVar16->element = local_48;
            if (iter2.list ==
                (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar11 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar11) goto LAB_00492029;
              *puVar13 = 0;
            }
            pSVar20 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                      ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            iter2.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *
                         )0x0;
            if (pSVar20 !=
                (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)newValue
               ) {
              iter2.list = pSVar20;
            }
          }
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 < *(uint *)&iter.last[1].next);
    }
    JsUtil::
    BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Clear(this->globOpt->valuesCreatedForMerge);
    JsUtil::
    BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Reset((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)local_f8);
    if (mergedValueTypesTrackedForKills->head != (Type_conflict)0x0) {
      pJVar7 = mergedValueTypesTrackedForKills->alloc;
      pBVar8 = mergedValueTypesTrackedForKills->head;
      pBVar22 = pJVar7->bvFreeList;
      do {
        pBVar19 = pBVar8;
        pBVar8 = pBVar19->next;
        pBVar19->next = pBVar22;
        pBVar22 = pBVar19;
      } while (pBVar8 != (Type)0x0);
      pJVar7->bvFreeList = pBVar19;
    }
    mergedValueTypesTrackedForKills->head = (Type_conflict)0x0;
    mergedValueTypesTrackedForKills->lastFoundIndex = (Type_conflict)0x0;
    mergedValueTypesTrackedForKills->lastUsedNodePrevNextField =
         &mergedValueTypesTrackedForKills->head;
    ValueHashTable<ExprHash,_Value_*>::And
              (this->exprToValueMap,(fromBlock->globOptData).exprToValueMap);
    GlobOpt::ProcessValueKills(this->globOpt,toBlock,this);
    if ((uVar1 & 4) == 0) {
LAB_0049200b:
      JsUtil::
      BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::~BaseDictionary((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                         *)local_f8);
      return;
    }
    GlobOpt::ProcessValueKillsForLoopHeaderAfterBackEdgeMerge(this->globOpt,toBlock,this);
    pSVar20 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
              &toBlock->predList;
    local_70 = (undefined1  [8])pSVar20;
    iter.super_Iterator.list = pSVar20;
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pBVar9 = (BasicBlock *)0x0;
LAB_00491f07:
    pBVar24 = pBVar9;
    if (pSVar20 == (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0)
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar13 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                          ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar11) goto LAB_00492029;
      *puVar13 = 0;
      pSVar20 = iter.super_Iterator.list;
    }
    pSVar20 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
              (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
               &pSVar20->super_SListNodeBase<Memory::ArenaAllocator>)->
              super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])pSVar20 == local_70) goto LAB_0049200b;
    iter.super_Iterator.list = pSVar20;
    ppFVar21 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)local_70);
    pBVar9 = (*ppFVar21)->predBlock;
    if (pBVar9 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar13 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                          ,0x34e,"(pred)","pred");
      if (!bVar11) goto LAB_00492029;
      *puVar13 = 0;
    }
    pSVar20 = iter.super_Iterator.list;
    if ((pBVar24 != (BasicBlock *)0x0) && (pBVar9->number <= pBVar24->number)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar13 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                          ,0x350,"(!lastBlock || pred->GetBlockNum() > lastBlock->GetBlockNum())",
                          "!lastBlock || pred->GetBlockNum() > lastBlock->GetBlockNum()");
      if (!bVar11) goto LAB_00492029;
      *puVar13 = 0;
      pSVar20 = iter.super_Iterator.list;
    }
    goto LAB_00491f07;
  }
LAB_00492029:
  pcVar10 = (code *)invalidInstructionException();
  (*pcVar10)();
}

Assistant:

void
GlobOptBlockData::MergeValueMaps(
    BasicBlock *toBlock,
    BasicBlock *fromBlock,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge)
{
    GlobOptBlockData *fromData = &(fromBlock->globOptData);
    bool isLoopBackEdge = toBlock->isLoopHeader;
    Loop *loop = toBlock->loop;
    bool isLoopPrepass = (loop && this->globOpt->prePassLoop == loop);

    Assert(this->globOpt->valuesCreatedForMerge->Count() == 0);
    DebugOnly(ValueSetByValueNumber mergedValues(this->globOpt->tempAlloc, 64));

    BVSparse<JitArenaAllocator> *const mergedValueTypesTrackedForKills = this->globOpt->tempBv;
    Assert(mergedValueTypesTrackedForKills->IsEmpty());
    this->valuesToKillOnCalls->Clear(); // the tracking will be reevaluated based on merged value types

    GlobHashTable *thisTable = this->symToValueMap;
    GlobHashTable *otherTable = fromData->symToValueMap;
    for (uint i = 0; i < thisTable->tableSize; i++)
    {
        SListBase<GlobHashBucket>::Iterator iter2(&otherTable->table[i]);
        iter2.Next();
        FOREACH_SLISTBASE_ENTRY_EDITING(GlobHashBucket, bucket, &thisTable->table[i], iter)
        {
            while (iter2.IsValid() && bucket.value->m_id < iter2.Data().value->m_id)
            {
                iter2.Next();
            }
            Value *newValue = nullptr;

            if (iter2.IsValid() && bucket.value->m_id == iter2.Data().value->m_id)
            {
                // Syms that are assigned to within the loop must have unique
                // value numbers in the loop header after merging; a single
                // prepass is not adequate to determine that sym values are
                // equivalent through all possible loop paths.
                bool forceUniqueValue =
                    isLoopBackEdge &&
                    !this->globOpt->IsLoopPrePass() &&
                    loop &&
                    loop->symsAssignedToInLoop->Test(bucket.value->m_id);

                newValue =
                    this->MergeValues(
                        bucket.element,
                        iter2.Data().element,
                        iter2.Data().value,
                        isLoopBackEdge,
                        forceUniqueValue,
                        symsRequiringCompensation,
                        symsCreatedForMerge);
            }
            if (newValue == nullptr)
            {
                iter.RemoveCurrent(thisTable->alloc);
                continue;
            }
            else
            {
#if DBG
                // Ensure that only one value per value number is produced by merge. Byte-code constant values are reused in
                // multiple blocks without cloning, so exclude those value numbers.
                {
                    Value *const previouslyMergedValue = mergedValues.Lookup(newValue->GetValueNumber());
                    if (previouslyMergedValue)
                    {
                        if (!this->globOpt->byteCodeConstantValueNumbersBv->Test(newValue->GetValueNumber()))
                        {
                            Assert(newValue == previouslyMergedValue);
                        }
                    }
                    else
                    {
                        mergedValues.Add(newValue);
                    }
                }
#endif

                this->globOpt->TrackMergedValueForKills(newValue, this, mergedValueTypesTrackedForKills);
                bucket.element = newValue;
            }
            iter2.Next();
        } NEXT_SLISTBASE_ENTRY_EDITING;

        if (isLoopPrepass && !this->globOpt->rootLoopPrePass->allFieldsKilled)
        {
            while (iter2.IsValid())
            {
                iter2.Next();
            }
        }
    }

    this->globOpt->valuesCreatedForMerge->Clear();
    DebugOnly(mergedValues.Reset());
    mergedValueTypesTrackedForKills->ClearAll();

    this->exprToValueMap->And(fromData->exprToValueMap);

    this->globOpt->ProcessValueKills(toBlock, this);

    bool isLastLoopBackEdge = false;

    if (isLoopBackEdge)
    {
        this->globOpt->ProcessValueKillsForLoopHeaderAfterBackEdgeMerge(toBlock, this);

        BasicBlock *lastBlock = nullptr;
        FOREACH_PREDECESSOR_BLOCK(pred, toBlock)
        {
            Assert(!lastBlock || pred->GetBlockNum() > lastBlock->GetBlockNum());
            lastBlock = pred;
        }NEXT_PREDECESSOR_BLOCK;
        isLastLoopBackEdge = (lastBlock == fromBlock);
    }
}